

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O3

void BuildAndStoreBlockSwitchEntropyCodes
               (BlockEncoder *self,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  uint8_t *depth;
  uint16_t *bits;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  byte *pbVar4;
  uint *puVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t local_4a8 [28];
  uint32_t type_histo [258];
  
  uVar9 = self->num_block_types_;
  pbVar4 = self->block_types_;
  puVar5 = self->block_lengths_;
  sVar6 = self->num_blocks_;
  switchD_00569a20::default(type_histo,0,uVar9 * 4 + 8);
  local_4a8[0] = 0;
  local_4a8[1] = 0;
  local_4a8[2] = 0;
  local_4a8[3] = 0;
  local_4a8[4] = 0;
  local_4a8[5] = 0;
  local_4a8[6] = 0;
  local_4a8[7] = 0;
  local_4a8[8] = 0;
  local_4a8[9] = 0;
  local_4a8[10] = 0;
  local_4a8[0xb] = 0;
  local_4a8[0xc] = 0;
  local_4a8[0xd] = 0;
  local_4a8[0xe] = 0;
  local_4a8[0xf] = 0;
  local_4a8[0x10] = 0;
  local_4a8[0x11] = 0;
  local_4a8[0x12] = 0;
  local_4a8[0x13] = 0;
  local_4a8[0x14] = 0;
  local_4a8[0x15] = 0;
  local_4a8[0x16] = 0;
  local_4a8[0x17] = 0;
  local_4a8[0x18] = 0;
  local_4a8[0x19] = 0;
  if (sVar6 != 0) {
    sVar10 = 0;
    uVar8 = 1;
    uVar11 = 0;
    do {
      uVar7 = uVar8;
      bVar1 = pbVar4[sVar10];
      uVar8 = (ulong)bVar1;
      if (sVar10 != 0) {
        uVar12 = (ulong)(bVar1 + 2);
        if (uVar11 == uVar8) {
          uVar12 = 0;
        }
        if (uVar7 + 1 == uVar8) {
          uVar12 = 1;
        }
        type_histo[uVar12] = type_histo[uVar12] + 1;
      }
      uVar3 = puVar5[sVar10];
      uVar11 = 0xe;
      if (0x2f0 < uVar3) {
        uVar11 = 0x14;
      }
      uVar12 = 0;
      if (0x28 < uVar3) {
        uVar12 = 7;
      }
      if (0xb0 < uVar3) {
        uVar12 = uVar11;
      }
      do {
        uVar11 = uVar12;
        if (uVar11 == 0x19) break;
        uVar12 = uVar11 + 1;
      } while (*(ushort *)(duckdb_brotli::_kBrotliPrefixCodeRanges + uVar11 * 4 + 4) <= uVar3);
      local_4a8[uVar11 & 0xffffffff] = local_4a8[uVar11 & 0xffffffff] + 1;
      sVar10 = sVar10 + 1;
      uVar11 = uVar7;
    } while (sVar10 != sVar6);
  }
  StoreVarLenUint8(uVar9 - 1,storage_ix,storage);
  if (1 < uVar9) {
    BuildAndStoreHuffmanTree
              (type_histo,uVar9 + 2,uVar9 + 2,tree,(self->block_split_code_).type_depths,
               (self->block_split_code_).type_bits,storage_ix,storage);
    depth = (self->block_split_code_).length_depths;
    bits = (self->block_split_code_).length_bits;
    BuildAndStoreHuffmanTree(local_4a8,0x1a,0x1a,tree,depth,bits,storage_ix,storage);
    uVar3 = *puVar5;
    bVar1 = *pbVar4;
    (self->block_split_code_).type_code_calculator.second_last_type =
         (self->block_split_code_).type_code_calculator.last_type;
    (self->block_split_code_).type_code_calculator.last_type = (ulong)bVar1;
    uVar9 = 0xe;
    if (0x2f0 < uVar3) {
      uVar9 = 0x14;
    }
    uVar8 = 7;
    if (uVar3 < 0x29) {
      uVar8 = 0;
    }
    if (0xb0 < uVar3) {
      uVar8 = uVar9;
    }
    do {
      uVar9 = uVar8;
      if (uVar9 == 0x19) break;
      uVar8 = uVar9 + 1;
    } while (*(ushort *)(duckdb_brotli::_kBrotliPrefixCodeRanges + uVar9 * 4 + 4) <= uVar3);
    uVar9 = uVar9 & 0xffffffff;
    bVar1 = duckdb_brotli::_kBrotliPrefixCodeRanges[uVar9 * 4 + 2];
    uVar2 = *(ushort *)(duckdb_brotli::_kBrotliPrefixCodeRanges + uVar9 * 4);
    uVar8 = *storage_ix;
    uVar11 = depth[uVar9] + uVar8;
    *(ulong *)(storage + (uVar8 >> 3)) =
         (ulong)bits[uVar9] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
    *storage_ix = uVar11;
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)(uVar3 - uVar2) << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
    *storage_ix = uVar11 + bVar1;
  }
  return;
}

Assistant:

static void BuildAndStoreBlockSwitchEntropyCodes(BlockEncoder* self,
    HuffmanTree* tree, size_t* storage_ix, uint8_t* storage) {
  BuildAndStoreBlockSplitCode(self->block_types_, self->block_lengths_,
      self->num_blocks_, self->num_block_types_, tree, &self->block_split_code_,
      storage_ix, storage);
}